

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_20;
  void *local_10;
  
  local_20.super_LogMessage._0_8_ = MapFieldBase::arena(&this->super_MapFieldBase);
  local_10 = (void *)0x0;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                          ((Arena **)&local_20,&local_10,"arena() == nullptr");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    UntypedMapBase::ClearTable(&this->map_,false);
    MapFieldBase::~MapFieldBase(&this->super_MapFieldBase);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
             ,0xa0,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

DynamicMapField::~DynamicMapField() {
  ABSL_DCHECK_EQ(arena(), nullptr);
  map_.ClearTable(false);
}